

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::Fetch
          (RowGroupCollection *this,TransactionData transaction,DataChunk *result,
          vector<duckdb::StorageIndex,_true> *column_ids,Vector *row_identifiers,idx_t fetch_count,
          ColumnFetchState *state)

{
  idx_t row_number;
  bool bVar1;
  RowGroupSegmentTree *pRVar2;
  RowGroup *this_00;
  idx_t iVar3;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_01;
  SegmentLock l;
  idx_t segment_index;
  idx_t local_78;
  unique_lock<std::mutex> local_68;
  vector<duckdb::StorageIndex,_true> *local_58;
  ColumnFetchState *local_50;
  data_ptr_t local_48;
  idx_t local_40;
  idx_t local_38;
  
  if (fetch_count == 0) {
    local_78 = 0;
  }
  else {
    local_48 = row_identifiers->data;
    this_01 = &this->row_groups;
    local_78 = 0;
    iVar3 = 0;
    local_58 = column_ids;
    local_50 = state;
    local_40 = fetch_count;
    do {
      row_number = *(idx_t *)(local_48 + iVar3 * 8);
      pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
      local_68._M_device = &(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
      local_68._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_68);
      local_68._M_owns = true;
      pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
      bVar1 = SegmentTree<duckdb::RowGroup,_true>::TryGetSegmentIndex
                        (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_68
                         ,row_number,&local_38);
      if (bVar1) {
        pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
        this_00 = SegmentTree<duckdb::RowGroup,_true>::GetSegmentByIndex
                            (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,
                             (SegmentLock *)&local_68,local_38);
        ::std::unique_lock<std::mutex>::~unique_lock(&local_68);
        bVar1 = RowGroup::Fetch(this_00,transaction,
                                row_number - (this_00->super_SegmentBase<duckdb::RowGroup>).start);
        if (bVar1) {
          RowGroup::FetchRow(this_00,transaction,local_50,local_58,row_number,result,local_78);
          local_78 = local_78 + 1;
        }
      }
      else {
        ::std::unique_lock<std::mutex>::~unique_lock(&local_68);
      }
      iVar3 = iVar3 + 1;
    } while (local_40 != iVar3);
  }
  result->count = local_78;
  return;
}

Assistant:

void RowGroupCollection::Fetch(TransactionData transaction, DataChunk &result, const vector<StorageIndex> &column_ids,
                               const Vector &row_identifiers, idx_t fetch_count, ColumnFetchState &state) {
	// figure out which row_group to fetch from
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);
	idx_t count = 0;
	for (idx_t i = 0; i < fetch_count; i++) {
		auto row_id = row_ids[i];
		RowGroup *row_group;
		{
			idx_t segment_index;
			auto l = row_groups->Lock();
			if (!row_groups->TryGetSegmentIndex(l, UnsafeNumericCast<idx_t>(row_id), segment_index)) {
				// in parallel append scenarios it is possible for the row_id
				continue;
			}
			row_group = row_groups->GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
		}
		if (!row_group->Fetch(transaction, UnsafeNumericCast<idx_t>(row_id) - row_group->start)) {
			continue;
		}
		row_group->FetchRow(transaction, state, column_ids, row_id, result, count);
		count++;
	}
	result.SetCardinality(count);
}